

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  numpunct *pnVar5;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar6;
  appender aVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  long lVar14;
  size_t sVar15;
  bool bVar16;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_cf [3];
  uint local_cc;
  undefined1 local_c8 [12];
  int local_bc;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char local_90;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_88;
  decimal_fp<float> *local_80;
  undefined1 local_78 [8];
  undefined8 local_70;
  undefined8 local_68;
  decimal_fp<float> *local_60;
  digit_grouping<char> *local_58;
  digit_grouping<char> *local_50;
  uint *local_48;
  uint *local_40;
  char *local_38;
  
  local_b8._0_4_ = f->significand;
  uVar12 = 0x1f;
  if ((local_b8._0_4_ | 1) != 0) {
    for (; (local_b8._0_4_ | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar9 = (ulong)(uint)local_b8._0_4_ +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar12 * 8);
  local_bc = (int)(uVar9 >> 0x20);
  local_cf[2] = 0x30;
  local_c8._4_4_ = fspecs._4_4_;
  local_cf[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if ((long)uVar9 < 0) goto LAB_00228aee;
  bVar16 = local_cf[1] != none;
  cVar2 = '.';
  uVar12 = (uint)local_c8._4_4_ >> 0x11;
  local_c8._0_8_ = fspecs;
  if ((uVar12 & 1) != 0) {
    local_88 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    local_80 = f;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_78);
    }
    else {
      std::locale::locale((locale *)local_78,(locale *)loc.locale_);
    }
    pnVar5 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_78);
    cVar2 = (**(code **)(*(long *)pnVar5 + 0x10))(pnVar5);
    std::locale::~locale((locale *)local_78);
    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container = local_88;
    f = local_80;
  }
  lVar14 = (uVar9 >> 0x20) + (ulong)bVar16;
  uVar12 = f->exponent;
  local_b8._4_4_ = local_bc + uVar12;
  iVar11 = (int)local_c8._0_8_;
  local_cf[0] = cVar2;
  if (SUB81(local_c8._0_8_,4) == '\x01') {
LAB_0022877a:
    iVar4 = uVar12 + local_bc + -1;
    if (((uint)local_c8._4_4_ >> 0x13 & 1) == 0) {
      uVar9 = 0;
      if (local_bc == 1) {
        local_cf[0] = '\0';
      }
    }
    else {
      uVar9 = 0;
      if (0 < iVar11 - local_bc) {
        uVar9 = (ulong)(uint)(iVar11 - local_bc);
      }
      lVar14 = lVar14 + uVar9;
    }
    local_78[0] = local_cf[1];
    local_78._4_4_ = local_b8._0_4_;
    local_70._0_5_ = CONCAT14(local_cf[0],local_bc);
    local_68._0_5_ = CONCAT14('0',(int)uVar9);
    local_68 = (bool *)(CONCAT26(local_68._6_2_,
                                 CONCAT15((((uint)local_c8._4_4_ >> 0x10 & 1) == 0) << 5,
                                          (undefined5)local_68)) | 0x450000000000);
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar4);
    if (specs->width < 1) {
      bVar6.container =
           (buffer<char> *)
           do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_78,
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_b8._4_4_ < 1) {
        iVar4 = 1 - local_b8._4_4_;
      }
      lVar10 = 2;
      if (99 < iVar4) {
        lVar10 = (ulong)(999 < iVar4) + 3;
      }
      sVar15 = lVar14 + lVar10 + (3 - (ulong)(local_cf[0] == '\0'));
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                     (out,specs,sVar15,sVar15,(anon_class_28_8_ad0ecca5 *)local_78);
    }
  }
  else {
    if ((local_c8._0_8_ & 0xff00000000) == 0) {
      iVar4 = 0x10;
      if (0 < iVar11) {
        iVar4 = iVar11;
      }
      if (((int)local_b8._4_4_ < -3) || (iVar4 < (int)local_b8._4_4_)) goto LAB_0022877a;
    }
    if ((int)uVar12 < 0) {
      if ((int)local_b8._4_4_ < 1) {
        iVar4 = -local_b8._4_4_;
        local_b0._0_4_ = iVar4;
        if (SBORROW4(iVar11,iVar4) != iVar11 + local_b8._4_4_ < 0) {
          local_b0._0_4_ = iVar11;
        }
        if (iVar11 < 0) {
          local_b0._0_4_ = iVar4;
        }
        if (local_bc != 0) {
          local_b0._0_4_ = iVar4;
        }
        bVar3 = 1;
        if (local_bc == 0 && local_b0._0_4_ == 0) {
          bVar3 = (local_c8[6] & 8) >> 3;
        }
        local_cc = CONCAT31(local_cc._1_3_,bVar3);
        fVar1 = (float_specs)local_c8._0_8_;
        if (-1 < (int)local_b0._0_4_) {
          sVar15 = lVar14 + (ulong)((uint)bVar3 + local_b0._0_4_ + 1);
          local_78 = (undefined1  [8])(local_cf + 1);
          local_70 = (significand_type *)(local_cf + 2);
          local_68 = (bool *)&local_cc;
          local_60 = (decimal_fp<float> *)local_cf;
          local_58 = (digit_grouping<char> *)local_b0;
          local_50 = (digit_grouping<char> *)local_b8;
          local_48 = (uint *)&local_bc;
          aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                            (out,specs,sVar15,sVar15,(anon_class_56_7_162c6e41 *)local_78);
          return (appender)
                 aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.
                 container;
        }
LAB_00228aee:
        local_c8._0_8_ = fVar1;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                    ,0x199,"negative value");
      }
      uVar12 = iVar11 - local_bc & (int)(local_c8._4_4_ << 0xc) >> 0x1f;
      local_cc = uVar12;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b0,loc,
                 (bool)((byte)((uint)local_c8._4_4_ >> 0x11) & 1));
      pbVar8 = (byte *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      pbVar13 = pbVar8 + local_b0._8_8_;
      iVar11 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      sVar15 = (ulong)uVar12 + (uVar9 >> 0x20) + (ulong)bVar16;
      do {
        iVar4 = 0x7fffffff;
        if (local_90 != '\0') {
          if (pbVar8 == pbVar13) {
            uVar12 = (uint)(char)pbVar13[-1];
          }
          else {
            bVar3 = *pbVar8;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_002289c5;
            pbVar8 = pbVar8 + 1;
            uVar12 = (uint)bVar3;
          }
          iVar11 = iVar11 + uVar12;
          iVar4 = iVar11;
        }
LAB_002289c5:
        sVar15 = sVar15 + 1;
      } while (iVar4 < local_bc);
      local_78 = (undefined1  [8])(local_cf + 1);
      local_70 = (significand_type *)local_b8;
      local_68 = (bool *)&local_bc;
      local_60 = (decimal_fp<float> *)(local_b8 + 4);
      local_58 = (digit_grouping<char> *)local_cf;
      local_48 = &local_cc;
      local_40 = (uint *)(local_cf + 2);
      local_50 = (digit_grouping<char> *)local_b0;
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                     (out,specs,sVar15,sVar15,(anon_class_64_8_e6ffa566 *)local_78);
    }
    else {
      lVar14 = lVar14 + (ulong)uVar12;
      local_cc = iVar11 - local_b8._4_4_;
      if (((uint)local_c8._4_4_ >> 0x13 & 1) != 0) {
        if (SUB81(local_c8._0_8_,4) != '\x02' && (int)local_cc < 1) {
          local_cc = 1;
        }
        lVar14 = lVar14 + 1;
        if (0 < (long)(int)local_cc) {
          lVar14 = lVar14 + (int)local_cc;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b0,loc,
                 (bool)((byte)((uint)local_c8._4_4_ >> 0x11) & 1));
      pbVar8 = (byte *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      pbVar13 = pbVar8 + local_b0._8_8_;
      sVar15 = lVar14 - 1;
      iVar11 = 0;
      do {
        iVar4 = 0x7fffffff;
        if (local_90 != '\0') {
          if (pbVar8 == pbVar13) {
            uVar12 = (uint)(char)pbVar13[-1];
          }
          else {
            bVar3 = *pbVar8;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_002288b3;
            pbVar8 = pbVar8 + 1;
            uVar12 = (uint)bVar3;
          }
          iVar11 = iVar11 + uVar12;
          iVar4 = iVar11;
        }
LAB_002288b3:
        sVar15 = sVar15 + 1;
      } while (iVar4 < (int)local_b8._4_4_);
      local_78 = (undefined1  [8])(local_cf + 1);
      local_70 = (significand_type *)local_b8;
      local_68 = (bool *)&local_bc;
      local_50 = (digit_grouping<char> *)local_c8;
      local_48 = (uint *)local_cf;
      local_40 = &local_cc;
      local_38 = local_cf + 2;
      local_60 = f;
      local_58 = (digit_grouping<char> *)local_b0;
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                     (out,specs,sVar15,sVar15,(anon_class_72_9_0c6a3a8a *)local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b0._4_4_,local_b0._0_4_),local_a0._M_allocated_capacity + 1)
      ;
    }
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}